

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

void checkformat(lua_State *L,char *form,char *flags,int precision)

{
  int iVar1;
  size_t sVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  sVar2 = strspn(form + 1,flags);
  pbVar3 = (byte *)(form + sVar2 + 1);
  if (*pbVar3 != 0x30) {
    pbVar4 = pbVar3;
    if (*pbVar3 - 0x30 < 10) {
      pbVar4 = (byte *)(form + sVar2 + 3);
      if (9 < (byte)form[sVar2 + 2] - 0x30) {
        pbVar4 = (byte *)(form + sVar2 + 2);
      }
    }
    pbVar3 = pbVar4;
    if ((precision != 0) && (*pbVar4 == 0x2e)) {
      if (pbVar4[1] - 0x30 < 10) {
        pbVar3 = pbVar4 + 3;
        if (9 < pbVar4[2] - 0x30) {
          pbVar3 = pbVar4 + 2;
        }
      }
      else {
        pbVar3 = pbVar4 + 1;
      }
    }
  }
  iVar1 = isalpha((uint)*pbVar3);
  if (iVar1 == 0) {
    luaL_error(L,"invalid conversion specification: \'%s\'",form);
    return;
  }
  return;
}

Assistant:

static void checkformat (lua_State *L, const char *form, const char *flags,
                                       int precision) {
  const char *spec = form + 1;  /* skip '%' */
  spec += strspn(spec, flags);  /* skip flags */
  if (*spec != '0') {  /* a width cannot start with '0' */
    spec = get2digits(spec);  /* skip width */
    if (*spec == '.' && precision) {
      spec++;
      spec = get2digits(spec);  /* skip precision */
    }
  }
  if (!isalpha(uchar(*spec)))  /* did not go to the end? */
    luaL_error(L, "invalid conversion specification: '%s'", form);
}